

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O2

int RqInterInit(int nK,int nMaxExtra,RqInterWorkMem *pInterWorkMem,size_t nInterWorkMemSize)

{
  int iVar1;
  undefined8 uStack_60;
  int local_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int local_44;
  int iStack_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  if (nInterWorkMemSize < 0x34) {
    uStack_60 = 0x55;
  }
  else {
    parameters_get(nK);
    (pInterWorkMem->params).W = iStack_38;
    (pInterWorkMem->params).P = iStack_34;
    (pInterWorkMem->params).P1 = iStack_30;
    (pInterWorkMem->params).U = iStack_2c;
    (pInterWorkMem->params).S = local_44;
    (pInterWorkMem->params).H = iStack_40;
    (pInterWorkMem->params).B = iStack_3c;
    (pInterWorkMem->params).W = iStack_38;
    (pInterWorkMem->params).K = local_54;
    (pInterWorkMem->params).Kprime = iStack_50;
    (pInterWorkMem->params).J = iStack_4c;
    (pInterWorkMem->params).L = iStack_48;
    if ((pInterWorkMem->params).K == -1) {
      fprintf(_stderr,"Error:%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c"
              ,0x5a,"Unsupported K value.");
      return -2;
    }
    iVar1 = (int)(nInterWorkMemSize + 0x3ffffffcc >> 2);
    pInterWorkMem->nESI_max = iVar1;
    if (nMaxExtra + nK <= iVar1) {
      pInterWorkMem->nESI = 0;
      return 0;
    }
    uStack_60 = 0x61;
  }
  fprintf(_stderr,"Error:%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
          uStack_60,"Insufficient inter work memory size.");
  return -1;
}

Assistant:

int RqInterInit(int nK,
		   int nMaxExtra,
		   RqInterWorkMem* pInterWorkMem,
		   size_t nInterWorkMemSize)
{
	if (nInterWorkMemSize < sizeof(RqInterWorkMem)) {
		errmsg("Insufficient inter work memory size.");
		return RQ_ERR_ENOMEM;
	}
	pInterWorkMem->params = parameters_get(nK);
	if (pInterWorkMem->params.K == -1) {
		errmsg("Unsupported K value.");
		return RQ_ERR_EDOM;
	}
	assert(pInterWorkMem->params.K == nK);
	pInterWorkMem->nESI_max
	  = (nInterWorkMemSize - sizeof(RqInterWorkMem)) / sizeof(uint32_t);
	if (pInterWorkMem->nESI_max < nK + nMaxExtra) {
		errmsg("Insufficient inter work memory size.");
		return RQ_ERR_ENOMEM;
	}

	pInterWorkMem->nESI = 0;
	return 0;
}